

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upward_rounding.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3ed3::FlexFloatUpwardRoundingTest_LessThanDenormalSmallest1_Test::TestBody
          (FlexFloatUpwardRoundingTest_LessThanDenormalSmallest1_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> ff_val;
  double val;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *in_stack_000000f8;
  double *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *o;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_01;
  string *lhs_expression;
  int line;
  char *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  AssertHelper *in_stack_ffffffffffffff90;
  string local_60 [32];
  AssertionResult local_40;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_30;
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *this_02;
  
  fesetround(0x800);
  this_02 = (AssertHelper *)0x3f98000000000000;
  this_01 = (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&stack0xffffffffffffffe0;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat(this_01);
  o = &local_30;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
            ((flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator=(this_01,o);
  lhs_expression = local_60;
  bitstring<(unsigned_char)3,(unsigned_char)3>(in_stack_000000f8);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)lhs_expression,(char *)this_01,(char (*) [10])o,in_stack_ffffffffffffff60);
  line = (int)((ulong)lhs_expression >> 0x20);
  std::__cxx11::string::~string(local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x179acf)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,line,
               (char *)this_01);
    testing::internal::AssertHelper::operator=(this_02,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x179b1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x179b6d);
  return;
}

Assistant:

TEST(FlexFloatUpwardRoundingTest, LessThanDenormalSmallest1) {
    fesetround(FE_UPWARD);
    const double val = 0.0234375; // 1/32-1/64 = 3/128
    flexfloat<3, 3> ff_val;
    ff_val = val;
    EXPECT_EQ("0-000-001", bitstring(ff_val));
}